

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

int fmt::v9::detail::format_float<long_double>
              (longdouble value,int precision,float_specs specs,buffer<char> *buf)

{
  long lVar1;
  basic_fp<unsigned___int128> value_00;
  unkbyte10 Var2;
  buffer<char> *pbVar3;
  ulong uVar4;
  size_t sVar5;
  uint uVar6;
  uint uVar7;
  int biased_e;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  bool bVar11;
  bool bVar12;
  double dVar13;
  int local_90;
  float local_8c;
  undefined1 local_88 [24];
  buffer<char> *local_70;
  longdouble local_64;
  ulong local_58;
  undefined8 uStack_50;
  int local_48;
  undefined4 uStack_44;
  undefined8 uStack_40;
  
  uVar9 = (ulong)(uint)precision;
  uVar10 = (ulong)specs & 0xff00000000;
  if (value <= (longdouble)0) {
    if (precision < 1 || uVar10 != 0x200000000) {
      sVar5 = buf->size_;
      uVar9 = sVar5 + 1;
      if (buf->capacity_ < uVar9) {
        (**buf->_vptr_buffer)(buf);
        sVar5 = buf->size_;
        uVar9 = sVar5 + 1;
      }
      buf->size_ = uVar9;
      buf->ptr_[sVar5] = '0';
      local_90 = 0;
    }
    else {
      uVar10 = buf->capacity_;
      if (uVar10 < uVar9) {
        (**buf->_vptr_buffer)(buf,uVar9);
        uVar10 = buf->capacity_;
      }
      if (uVar9 <= uVar10) {
        uVar10 = uVar9;
      }
      buf->size_ = uVar10;
      memset(buf->ptr_,0x30,uVar9);
      local_90 = -precision;
    }
  }
  else {
    local_64 = value;
    local_88._0_10_ = value;
    Var2 = local_88._0_10_;
    local_88._8_2_ = (undefined2)((unkuint10)value >> 0x40);
    uVar6 = (uint)(ushort)local_88._8_2_;
    iVar8 = (uVar6 & 0x7fff) + (uint)(((unkuint10)value & 0x7fff) == 0);
    local_88._0_8_ = SUB108(value,0);
    uVar9 = local_88._0_8_;
    uVar4 = (ulong)local_88._0_8_ >> 1;
    lVar1 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    uVar7 = 0x7f;
    if (uVar4 != 0) {
      uVar7 = (uint)lVar1;
    }
    local_88._0_10_ = Var2;
    local_70 = buf;
    dVar13 = ceil((double)(int)((iVar8 - (uVar7 ^ 0x3f)) + -0x3ffe) * 0.3010299956639812 + -1e-10);
    pbVar3 = local_70;
    local_90 = (int)dVar13;
    if ((specs._4_4_ >> 0x12 & 1) == 0) {
      local_48 = iVar8 + -0x403e;
      bVar12 = uVar9 == 0;
      bVar11 = (uVar6 & 0x7fff) < 2;
    }
    else {
      local_8c = (float)local_64;
      uVar7 = (uint)local_8c & 0x7fffff;
      uVar6 = (uint)local_8c & 0x7f800000;
      uVar9 = (ulong)uVar7 + 0x800000;
      if (uVar6 == 0) {
        uVar9 = (ulong)uVar7;
      }
      local_48 = -0x95;
      if (uVar6 != 0) {
        local_48 = (uVar6 >> 0x17) - 0x96;
      }
      bVar12 = uVar7 == 0;
      bVar11 = uVar6 < 0x1000000;
    }
    uVar6 = (byte)(!bVar11 & bVar12) | 6;
    if (uVar10 != 0x200000000) {
      uVar6 = (byte)(!bVar11 & bVar12) + 2;
    }
    iVar8 = 0x2ff;
    if (precision < 0x2ff) {
      iVar8 = precision;
    }
    uStack_50 = 0;
    value_00._20_4_ = uStack_44;
    value_00.e = local_48;
    value_00.f._8_8_ = 0;
    value_00.f._0_8_ = uVar9;
    value_00._24_8_ = uStack_40;
    local_58 = uVar9;
    format_dragon(value_00,uVar6,iVar8,local_70,&local_90);
    if ((specs._4_4_ >> 0x13 & 1) == 0 && uVar10 != 0x200000000) {
      uVar9 = pbVar3->size_;
      if (uVar9 != 0) {
        do {
          iVar8 = local_90 + 1;
          if (pbVar3->ptr_[uVar9 - 1] != '0') {
            uVar10 = pbVar3->capacity_;
            if (uVar10 < uVar9) {
              (**pbVar3->_vptr_buffer)(pbVar3,uVar9);
              uVar10 = pbVar3->capacity_;
            }
            goto LAB_0012b296;
          }
          uVar9 = uVar9 - 1;
          local_90 = iVar8;
        } while (uVar9 != 0);
      }
      uVar10 = pbVar3->capacity_;
      uVar9 = 0;
LAB_0012b296:
      if (uVar10 < uVar9) {
        uVar9 = uVar10;
      }
      pbVar3->size_ = uVar9;
    }
  }
  return local_90;
}

Assistant:

FMT_CONSTEXPR20 auto format_float(Float value, int precision, float_specs specs,
                                  buffer<char>& buf) -> int {
  // float is passed as double to reduce the number of instantiations.
  static_assert(!std::is_same<Float, float>::value, "");
  FMT_ASSERT(value >= 0, "value is negative");
  auto converted_value = convert_float(value);

  const bool fixed = specs.format == float_format::fixed;
  if (value <= 0) {  // <= instead of == to silence a warning.
    if (precision <= 0 || !fixed) {
      buf.push_back('0');
      return 0;
    }
    buf.try_resize(to_unsigned(precision));
    fill_n(buf.data(), precision, '0');
    return -precision;
  }

  int exp = 0;
  bool use_dragon = true;
  unsigned dragon_flags = 0;
  if (!is_fast_float<Float>()) {
    const auto inv_log2_10 = 0.3010299956639812;  // 1 / log2(10)
    using info = dragonbox::float_info<decltype(converted_value)>;
    const auto f = basic_fp<typename info::carrier_uint>(converted_value);
    // Compute exp, an approximate power of 10, such that
    //   10^(exp - 1) <= value < 10^exp or 10^exp <= value < 10^(exp + 1).
    // This is based on log10(value) == log2(value) / log2(10) and approximation
    // of log2(value) by e + num_fraction_bits idea from double-conversion.
    exp = static_cast<int>(
        std::ceil((f.e + count_digits<1>(f.f) - 1) * inv_log2_10 - 1e-10));
    dragon_flags = dragon::fixup;
  } else if (!is_constant_evaluated() && precision < 0) {
    // Use Dragonbox for the shortest format.
    if (specs.binary32) {
      auto dec = dragonbox::to_decimal(static_cast<float>(value));
      write<char>(buffer_appender<char>(buf), dec.significand);
      return dec.exponent;
    }
    auto dec = dragonbox::to_decimal(static_cast<double>(value));
    write<char>(buffer_appender<char>(buf), dec.significand);
    return dec.exponent;
  } else {
    // Use Grisu + Dragon4 for the given precision:
    // https://www.cs.tufts.edu/~nr/cs257/archive/florian-loitsch/printf.pdf.
    const int min_exp = -60;  // alpha in Grisu.
    int cached_exp10 = 0;     // K in Grisu.
    fp normalized = normalize(fp(converted_value));
    const auto cached_pow = get_cached_power(
        min_exp - (normalized.e + fp::num_significand_bits), cached_exp10);
    normalized = normalized * cached_pow;
    gen_digits_handler handler{buf.data(), 0, precision, -cached_exp10, fixed};
    if (grisu_gen_digits(normalized, 1, exp, handler) != digits::error &&
        !is_constant_evaluated()) {
      exp += handler.exp10;
      buf.try_resize(to_unsigned(handler.size));
      use_dragon = false;
    } else {
      exp += handler.size - cached_exp10 - 1;
      precision = handler.precision;
    }
  }
  if (use_dragon) {
    auto f = basic_fp<uint128_t>();
    bool is_predecessor_closer = specs.binary32
                                     ? f.assign(static_cast<float>(value))
                                     : f.assign(converted_value);
    if (is_predecessor_closer) dragon_flags |= dragon::predecessor_closer;
    if (fixed) dragon_flags |= dragon::fixed;
    // Limit precision to the maximum possible number of significant digits in
    // an IEEE754 double because we don't need to generate zeros.
    const int max_double_digits = 767;
    if (precision > max_double_digits) precision = max_double_digits;
    format_dragon(f, dragon_flags, precision, buf, exp);
  }
  if (!fixed && !specs.showpoint) {
    // Remove trailing zeros.
    auto num_digits = buf.size();
    while (num_digits > 0 && buf[num_digits - 1] == '0') {
      --num_digits;
      ++exp;
    }
    buf.try_resize(num_digits);
  }
  return exp;
}